

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

string * __thiscall
wasm::Pass::getArgument
          (string *__return_storage_ptr__,Pass *this,string *key,string *errorTextIfMissing)

{
  size_t __n;
  _Alloc_hider _Var1;
  PassRunner *pPVar2;
  bool bVar3;
  int iVar4;
  pointer pcVar5;
  Fatal local_1f8;
  string local_70;
  string local_50;
  
  bVar3 = hasArgument(this,key);
  if (!bVar3) {
    Fatal::Fatal(&local_1f8);
    Fatal::operator<<(&local_1f8,errorTextIfMissing);
    Fatal::~Fatal(&local_1f8);
  }
  __n = key->_M_string_length;
  if (__n == (this->name)._M_string_length) {
    if (__n != 0) {
      pcVar5 = (key->_M_dataplus)._M_p;
      iVar4 = bcmp(pcVar5,(this->name)._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_0078e072;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var1._M_p = (this->passArg).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var1._M_p,
               _Var1._M_p +
               (this->passArg).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  else {
    pcVar5 = (key->_M_dataplus)._M_p;
LAB_0078e072:
    pPVar2 = this->runner;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar5,pcVar5 + __n);
    pcVar5 = (errorTextIfMissing->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar5,pcVar5 + errorTextIfMissing->_M_string_length);
    PassOptions::getArgument(__return_storage_ptr__,&pPVar2->options,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgument(const std::string& key,
                              const std::string& errorTextIfMissing) {
  if (!hasArgument(key)) {
    Fatal() << errorTextIfMissing;
  }

  return (key == name) ? *passArg
                       : getPassOptions().getArgument(key, errorTextIfMissing);
}